

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  long lVar1;
  void *pvVar2;
  ulong __size;
  ulong in_RSI;
  archive *in_RDI;
  int end_of_data;
  uchar *buff_out;
  void *buff_in;
  size_t bytes_out;
  size_t bytes_in;
  size_t new_size;
  void *p;
  size_t used;
  void *in_stack_00000048;
  int r;
  ssize_t bytes_avail;
  _7zip_conflict *zip;
  size_t in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ulong local_58;
  ulong local_50;
  long local_38;
  ulong local_28;
  ssize_t local_8;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if ((*(long *)(lVar1 + 0x128) == 0) && (*(long *)(lVar1 + 0x130) == -1)) {
    pvVar2 = __archive_read_ahead
                       ((archive_read *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88,(ssize_t *)0x1ab12d);
    if ((pvVar2 == (void *)0x0) || ((long)local_28 < 1)) {
      archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
      local_8 = -0x1e;
    }
    else {
      if (*(long *)(lVar1 + 0x118) < (long)local_28) {
        local_28 = *(ulong *)(lVar1 + 0x118);
      }
      *(ulong *)(lVar1 + 0x118) = *(long *)(lVar1 + 0x118) - local_28;
      if (*(long *)(lVar1 + 0x108) < (long)local_28) {
        local_28 = *(ulong *)(lVar1 + 0x108);
      }
      *(ulong *)(lVar1 + 0x108) = *(long *)(lVar1 + 0x108) - local_28;
      *(ulong *)(lVar1 + 0xf0) = local_28;
      local_8 = 0;
    }
  }
  else {
    if (*(long *)(lVar1 + 0xd8) == 0) {
      *(undefined8 *)(lVar1 + 0xe8) = 0x10000;
      if (*(ulong *)(lVar1 + 0xe8) < in_RSI) {
        *(ulong *)(lVar1 + 0xe8) = in_RSI + 0x3ff;
        *(ulong *)(lVar1 + 0xe8) = *(ulong *)(lVar1 + 0xe8) & 0xfffffffffffffc00;
      }
      pvVar2 = malloc(*(size_t *)(lVar1 + 0xe8));
      *(void **)(lVar1 + 0xd8) = pvVar2;
      if (*(long *)(lVar1 + 0xd8) == 0) {
        archive_set_error(in_RDI,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      *(undefined8 *)(lVar1 + 0xf0) = 0;
    }
    else if ((*(ulong *)(lVar1 + 0xe8) < in_RSI) || (*(ulong *)(lVar1 + 0xf0) < in_RSI)) {
      if (*(long *)(lVar1 + 0xe0) == 0) {
        local_38 = 0;
      }
      else {
        local_38 = *(long *)(lVar1 + 0xe0) - *(long *)(lVar1 + 0xd8);
      }
      if (*(ulong *)(lVar1 + 0xe8) < in_RSI) {
        __size = in_RSI + 0x3ff & 0xfffffffffffffc00;
        pvVar2 = realloc(*(void **)(lVar1 + 0xd8),__size);
        if (pvVar2 == (void *)0x0) {
          archive_set_error(in_RDI,0xc,"No memory for 7-Zip decompression");
          return -0x1e;
        }
        *(void **)(lVar1 + 0xd8) = pvVar2;
        *(ulong *)(lVar1 + 0xe8) = __size;
      }
      if (local_38 != 0) {
        memmove(*(void **)(lVar1 + 0xd8),(void *)(*(long *)(lVar1 + 0xd8) + local_38),
                *(size_t *)(lVar1 + 0xf0));
      }
    }
    else {
      *(undefined8 *)(lVar1 + 0xf0) = 0;
    }
    *(undefined8 *)(lVar1 + 0xe0) = 0;
    while (__archive_read_ahead
                     ((archive_read *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,(ssize_t *)0x1ab444), 0 < (long)local_28) {
      local_58 = *(long *)(lVar1 + 0xe8) - *(long *)(lVar1 + 0xf0);
      local_50 = local_28;
      if (*(ulong *)(lVar1 + 0x118) < local_28) {
        local_50 = *(ulong *)(lVar1 + 0x118);
      }
      in_stack_ffffffffffffff90 =
           decompress((archive_read *)CONCAT44(zip._4_4_,zip._0_4_),(_7zip_conflict *)bytes_avail,
                      in_stack_00000048,(size_t *)used,p,(size_t *)new_size);
      if (in_stack_ffffffffffffff90 == 0) {
        in_stack_ffffffffffffff94 = 0;
      }
      else {
        if (in_stack_ffffffffffffff90 != 1) {
          return -0x1e;
        }
        in_stack_ffffffffffffff94 = 1;
      }
      *(ulong *)(lVar1 + 0x118) = *(long *)(lVar1 + 0x118) - local_50;
      if (*(ulong *)(lVar1 + 0x108) < local_58) {
        local_58 = *(ulong *)(lVar1 + 0x108);
      }
      *(ulong *)(lVar1 + 0x108) = *(long *)(lVar1 + 0x108) - local_58;
      *(ulong *)(lVar1 + 0xf0) = local_58 + *(long *)(lVar1 + 0xf0);
      *(ulong *)(lVar1 + 0x120) = local_50;
      if ((*(long *)(lVar1 + 0xf0) == *(long *)(lVar1 + 0xe8)) ||
         ((((*(long *)(lVar1 + 0x130) == 0x3030103 && (*(long *)(lVar1 + 0x4db0) != 0)) &&
           (*(ulong *)(lVar1 + 0xe8) < *(long *)(lVar1 + 0xf0) + 5U)) ||
          ((*(long *)(lVar1 + 0x118) == 0 && (*(long *)(lVar1 + 0x108) == 0)))))) {
        if (*(ulong *)(lVar1 + 0xf0) < in_RSI) {
          archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
          return -0x1e;
        }
        *(undefined8 *)(lVar1 + 0xe0) = *(undefined8 *)(lVar1 + 0xd8);
        return 0;
      }
      if ((in_stack_ffffffffffffff94 != 0) || ((local_50 == 0 && (local_58 == 0)))) {
        archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
        return -0x1e;
      }
      read_consume((archive_read *)(ulong)in_stack_ffffffffffffff90);
    }
    archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
    local_8 = -0x1e;
  }
  return local_8;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}